

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pair.cc
# Opt level: O0

int bio_free(BIO *bio)

{
  long *orig_ptr;
  bio_bio_st *b;
  BIO *bio_local;
  
  orig_ptr = (long *)bio->ptr;
  if (orig_ptr != (long *)0x0) {
    if (*orig_ptr != 0) {
      bio_destroy_pair(bio);
    }
    OPENSSL_free((void *)orig_ptr[5]);
    OPENSSL_free(orig_ptr);
    return 1;
  }
  __assert_fail("b != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bio/pair.cc"
                ,0x5e,"int bio_free(BIO *)");
}

Assistant:

static int bio_free(BIO *bio) {
  struct bio_bio_st *b = reinterpret_cast<bio_bio_st *>(bio->ptr);

  assert(b != NULL);

  if (b->peer) {
    bio_destroy_pair(bio);
  }

  OPENSSL_free(b->buf);
  OPENSSL_free(b);

  return 1;
}